

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_20f12f9::Impl::~Impl(Impl *this)

{
  int in_ESI;
  
  (this->super_Session)._vptr_Session = (_func_int **)&PTR__Impl_00947080;
  dap::Chan<std::function<void_()>_>::close(&this->inbox,in_ESI);
  dap::ContentReader::close(&this->reader,in_ESI);
  dap::ContentWriter::close(&this->writer,in_ESI);
  if ((this->recvThread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->dispatchThread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  dap::Chan<std::function<void_()>_>::~Chan(&this->inbox);
  std::thread::~thread(&this->dispatchThread);
  std::thread::~thread(&this->recvThread);
  EventHandlers::~EventHandlers(&this->handlers);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->writer).writer.super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  dap::ContentReader::~ContentReader(&this->reader);
  return;
}

Assistant:

~Impl() {
    inbox.close();
    reader.close();
    writer.close();
    if (recvThread.joinable()) {
      recvThread.join();
    }
    if (dispatchThread.joinable()) {
      dispatchThread.join();
    }
  }